

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

void __thiscall HashMap<String,_Array<Address>_>::~HashMap(HashMap<String,_Array<Address>_> *this)

{
  Address *pAVar1;
  ItemBlock *pIVar2;
  ItemBlock *pIVar3;
  Item *this_00;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  for (this_00 = (this->_begin).item; this_00 != &this->endItem; this_00 = this_00->next) {
    pAVar1 = (this_00->value)._begin.item;
    if (pAVar1 != (Address *)0x0) {
      operator_delete__(pAVar1);
    }
    String::~String(&this_00->key);
  }
  pIVar3 = this->blocks;
  while (pIVar3 != (ItemBlock *)0x0) {
    pIVar2 = pIVar3->next;
    operator_delete__(pIVar3);
    pIVar3 = pIVar2;
  }
  pAVar1 = (this->endItem).value._begin.item;
  if (pAVar1 != (Address *)0x0) {
    operator_delete__(pAVar1);
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~HashMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }